

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O0

int Abc_NodeIsMuxType(Abc_Obj_t *pNode)

{
  int iVar1;
  int iVar2;
  Abc_Obj_t *pNode_00;
  Abc_Obj_t *pNode_01;
  bool local_45;
  bool local_2d;
  Abc_Obj_t *pNode1;
  Abc_Obj_t *pNode0;
  Abc_Obj_t *pNode_local;
  
  iVar1 = Abc_ObjIsComplement(pNode);
  if (iVar1 != 0) {
    __assert_fail("!Abc_ObjIsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcUtil.c"
                  ,0x541,"int Abc_NodeIsMuxType(Abc_Obj_t *)");
  }
  iVar1 = Abc_AigNodeIsAnd(pNode);
  if (iVar1 == 0) {
    return 0;
  }
  iVar1 = Abc_ObjFaninC0(pNode);
  if ((iVar1 == 0) || (iVar1 = Abc_ObjFaninC1(pNode), iVar1 == 0)) {
    return 0;
  }
  pNode_00 = Abc_ObjFanin0(pNode);
  pNode_01 = Abc_ObjFanin1(pNode);
  iVar1 = Abc_AigNodeIsAnd(pNode_00);
  if ((iVar1 == 0) || (iVar1 = Abc_AigNodeIsAnd(pNode_01), iVar1 == 0)) {
    return 0;
  }
  iVar1 = Abc_ObjFaninId0(pNode_00);
  iVar2 = Abc_ObjFaninId0(pNode_01);
  if (iVar1 == iVar2) {
    iVar1 = Abc_ObjFaninC0(pNode_00);
    iVar2 = Abc_ObjFaninC0(pNode_01);
    local_2d = true;
    if (iVar1 != iVar2) goto LAB_00b20b8b;
  }
  iVar1 = Abc_ObjFaninId0(pNode_00);
  iVar2 = Abc_ObjFaninId1(pNode_01);
  if (iVar1 == iVar2) {
    iVar1 = Abc_ObjFaninC0(pNode_00);
    iVar2 = Abc_ObjFaninC1(pNode_01);
    local_2d = true;
    if (iVar1 != iVar2) goto LAB_00b20b8b;
  }
  iVar1 = Abc_ObjFaninId1(pNode_00);
  iVar2 = Abc_ObjFaninId0(pNode_01);
  if (iVar1 == iVar2) {
    iVar1 = Abc_ObjFaninC1(pNode_00);
    iVar2 = Abc_ObjFaninC0(pNode_01);
    local_2d = true;
    if (iVar1 != iVar2) goto LAB_00b20b8b;
  }
  iVar1 = Abc_ObjFaninId1(pNode_00);
  iVar2 = Abc_ObjFaninId1(pNode_01);
  local_45 = false;
  if (iVar1 == iVar2) {
    iVar1 = Abc_ObjFaninC1(pNode_00);
    iVar2 = Abc_ObjFaninC1(pNode_01);
    local_45 = iVar1 != iVar2;
  }
  local_2d = local_45;
LAB_00b20b8b:
  return (uint)local_2d;
}

Assistant:

int Abc_NodeIsMuxType( Abc_Obj_t * pNode )
{
    Abc_Obj_t * pNode0, * pNode1;
    // check that the node is regular
    assert( !Abc_ObjIsComplement(pNode) );
    // if the node is not AND, this is not MUX
    if ( !Abc_AigNodeIsAnd(pNode) )
        return 0;
    // if the children are not complemented, this is not MUX
    if ( !Abc_ObjFaninC0(pNode) || !Abc_ObjFaninC1(pNode) )
        return 0;
    // get children
    pNode0 = Abc_ObjFanin0(pNode);
    pNode1 = Abc_ObjFanin1(pNode);
    // if the children are not ANDs, this is not MUX
    if ( !Abc_AigNodeIsAnd(pNode0) || !Abc_AigNodeIsAnd(pNode1) )
        return 0;
    // otherwise the node is MUX iff it has a pair of equal grandchildren with opposite polarity
    return (Abc_ObjFaninId0(pNode0) == Abc_ObjFaninId0(pNode1) && (Abc_ObjFaninC0(pNode0) ^ Abc_ObjFaninC0(pNode1))) || 
           (Abc_ObjFaninId0(pNode0) == Abc_ObjFaninId1(pNode1) && (Abc_ObjFaninC0(pNode0) ^ Abc_ObjFaninC1(pNode1))) ||
           (Abc_ObjFaninId1(pNode0) == Abc_ObjFaninId0(pNode1) && (Abc_ObjFaninC1(pNode0) ^ Abc_ObjFaninC0(pNode1))) ||
           (Abc_ObjFaninId1(pNode0) == Abc_ObjFaninId1(pNode1) && (Abc_ObjFaninC1(pNode0) ^ Abc_ObjFaninC1(pNode1)));
}